

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O3

int __thiscall agg::bspline::init(bspline *this,EVP_PKEY_CTX *ctx)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  int in_EAX;
  int extraout_EAX;
  int iVar5;
  long in_RCX;
  long in_RDX;
  long lVar6;
  
  if (2 < (int)ctx) {
    init(this,ctx);
    iVar2 = this->m_max;
    iVar5 = this->m_num;
    pdVar3 = this->m_x;
    pdVar4 = this->m_y;
    lVar6 = 0;
    do {
      if (iVar5 < iVar2) {
        dVar1 = *(double *)(in_RCX + lVar6 * 8);
        pdVar3[iVar5] = *(double *)(in_RDX + lVar6 * 8);
        pdVar4[iVar5] = dVar1;
        iVar5 = iVar5 + 1;
        this->m_num = iVar5;
      }
      lVar6 = lVar6 + 1;
    } while ((int)ctx != (int)lVar6);
    prepare(this);
    in_EAX = extraout_EAX;
  }
  this->m_last_idx = -1;
  return in_EAX;
}

Assistant:

void bspline::init(int num, const double* x, const double* y)
    {
        if(num > 2)
        {
            init(num);
            int i;
            for(i = 0; i < num; i++)
            {
                add_point(*x++, *y++);
            }
            prepare();
        }
        m_last_idx = -1;
    }